

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O3

char * zlib_wrapper_name(zlib_wrapper type)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint extraout_EAX;
  undefined8 *puVar4;
  char *pcVar5;
  undefined8 extraout_RAX;
  undefined8 *in_RCX;
  undefined8 *puVar6;
  ulong extraout_RDX;
  long extraout_RDX_00;
  ulong uVar7;
  undefined8 *in_RSI;
  ulong in_R8;
  undefined8 uVar8;
  ulong uVar9;
  long *aplStack_170 [2];
  long alStack_160 [2];
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  long lStack_128;
  long lStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_d0;
  char *pcStack_c8;
  code *pcStack_c0;
  undefined8 *puStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  
  if (type - kWrapperZLIB < 3) {
    return &DAT_001043b4 + *(int *)(&DAT_001043b4 + (ulong)(type - kWrapperZLIB) * 4);
  }
  zlib_wrapper_name();
  if ((type == kWrapperNONE) || (zlib_strategy == 0)) {
    return "";
  }
  if (zlib_strategy == 2) {
    return "huffman ";
  }
  if (zlib_strategy == 3) {
    return "rle ";
  }
  iVar1 = zlib_strategy;
  zlib_level_strategy_name();
  uVar7 = in_R8 & 0xffffffff;
  puVar6 = in_RCX;
  puVar4 = in_RSI;
  if ((int)in_R8 != 0) {
    pcStack_c0 = (code *)0x10289c;
    puVar4 = (undefined8 *)compressBound(extraout_RDX);
    pcStack_c0 = (code *)0x1028a9;
    std::__cxx11::string::resize((ulong)in_RCX,(char)puVar4);
  }
  uVar8 = in_RCX[1];
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  puStack_b8 = (undefined8 *)0x0;
  uStack_b0 = 0;
  if (iVar1 - 1U < 3) {
    puVar4 = (undefined8 *)(ulong)(uint)zlib_compression_level;
    puVar6 = (undefined8 *)(ulong)*(uint *)(&DAT_001043c0 + (ulong)(iVar1 - 1U) * 4);
    pcStack_c0 = (code *)0x70;
    pcStack_c8 = "1.3.0.1-motley";
    uStack_d0 = 0x102915;
    iVar1 = deflateInit2_(&puStack_b8,puVar4,8,puVar6,9,zlib_strategy);
    if (iVar1 != 0) goto LAB_00102998;
    if (in_RCX[1] == 0) {
      uStack_a0 = 0;
    }
    else {
      uStack_a0 = *in_RCX;
    }
    uStack_98 = CONCAT44(uStack_98._4_4_,(int)uVar8);
    uStack_b0 = CONCAT44(uStack_b0._4_4_,(int)extraout_RDX);
    puVar4 = (undefined8 *)0x4;
    pcStack_c0 = (code *)0x10294b;
    puStack_b8 = in_RSI;
    uVar2 = deflate(&puStack_b8);
    if ((int)uStack_b0 != 0) goto LAB_0010299f;
    uVar9 = (ulong)uVar2;
    if (uVar2 == 1) {
      uVar8 = uStack_90;
    }
    pcStack_c0 = (code *)0x102967;
    uVar3 = deflateEnd(&puStack_b8);
    uVar3 = uVar3 | uVar2;
    pcVar5 = (char *)(ulong)uVar3;
    if (uVar3 == 1) {
      if ((char)uVar7 != '\0') {
        pcStack_c0 = (code *)0x102981;
        pcVar5 = (char *)std::__cxx11::string::resize((ulong)in_RCX,(char)uVar8);
      }
      return pcVar5;
    }
  }
  else {
    pcStack_c0 = (code *)0x102998;
    zlib_compress();
LAB_00102998:
    pcStack_c0 = (code *)0x10299f;
    zlib_compress();
LAB_0010299f:
    pcStack_c0 = (code *)0x1029a4;
    zlib_compress();
    uVar9 = extraout_RDX;
    uVar3 = extraout_EAX;
  }
  pcStack_c0 = zlib_uncompress;
  zlib_compress();
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  lStack_120 = 0;
  uStack_118 = 0;
  uStack_130 = 0;
  lStack_128 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_d0 = uVar8;
  pcStack_c8 = (char *)uVar9;
  pcStack_c0 = (code *)uVar7;
  if (uVar3 - 1 < 3) {
    iVar1 = inflateInit2_(&uStack_150,*(undefined4 *)(&DAT_001043c0 + (ulong)(uVar3 - 1) * 4),
                          "1.3.0.1-motley");
    if (iVar1 == 0) {
      if (puVar6[1] == 0) {
        uStack_138 = 0;
      }
      else {
        uStack_138 = *puVar6;
      }
      uStack_130 = CONCAT44(uStack_130._4_4_,(int)puVar6[1]);
      uStack_150 = *puVar4;
      uStack_148 = CONCAT44(uStack_148._4_4_,*(undefined4 *)(puVar4 + 1));
      uVar3 = inflate(&uStack_150,4);
      uVar2 = 0xfffffffd;
      if (lStack_128 == extraout_RDX_00) {
        uVar2 = uVar3;
      }
      pcVar5 = (char *)inflateEnd(&uStack_150);
      if (((uint)pcVar5 | uVar2) == 1) {
        return pcVar5;
      }
      goto LAB_00102a8b;
    }
  }
  else {
    zlib_uncompress();
  }
  zlib_uncompress();
LAB_00102a8b:
  aplStack_170[0] = alStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_170,"uncompress failed: ","");
  if (lStack_120 != 0) {
    std::__cxx11::string::append((char *)aplStack_170);
  }
  zlib_uncompress();
  if (aplStack_170[0] != alStack_160) {
    operator_delete(aplStack_170[0],alStack_160[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

const char* zlib_wrapper_name(zlib_wrapper type) {
  if (type == kWrapperZLIB)
    return "ZLIB";
  if (type == kWrapperGZIP)
    return "GZIP";
  if (type == kWrapperZRAW)
    return "RAW";
  error_exit("bad wrapper type", int(type));
  return nullptr;
}